

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Button::draw(Button *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  Theme *pTVar11;
  undefined8 uVar12;
  long *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined8 in_XMM2_Qa;
  undefined4 uVar14;
  double dVar13;
  undefined8 in_XMM3_Qa;
  undefined4 uVar16;
  double dVar15;
  double y;
  SaveState state;
  ALLEGRO_COLOR bg;
  ALLEGRO_COLOR fg;
  Theme *theme;
  int in_stack_fffffffffffffb2c;
  SaveState *in_stack_fffffffffffffb30;
  ALLEGRO_FONT *pAVar17;
  undefined4 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  undefined8 uStack_18;
  
  uVar16 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
  uVar14 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  pTVar11 = Dialog::get_theme((Dialog *)in_RDI[3]);
  anon_unknown.dwarf_9285::SaveState::SaveState(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c)
  ;
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    uVar5 = (pTVar11->fg).r;
    uStack_18._0_4_ = (pTVar11->fg).b;
    uStack_18._4_4_ = (pTVar11->fg).a;
    uVar6 = (pTVar11->bg).r;
    uStack_28._0_4_ = (pTVar11->bg).b;
    uStack_28._4_4_ = (pTVar11->bg).a;
    local_20 = uVar5;
    local_30 = uVar6;
  }
  else {
    uVar3 = (pTVar11->bg).r;
    uStack_18._0_4_ = (pTVar11->bg).b;
    uStack_18._4_4_ = (pTVar11->bg).a;
    uVar4 = (pTVar11->fg).r;
    uStack_28._0_4_ = (pTVar11->fg).b;
    uStack_28._4_4_ = (pTVar11->fg).a;
    local_20 = uVar3;
    local_30 = uVar4;
  }
  bVar9 = (**(code **)(*in_RDI + 0x80))();
  if ((bVar9 & 1) != 0) {
    local_30 = al_map_rgb(0x40,0x40);
    uStack_28 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  }
  al_draw_filled_rectangle
            ((float)(int)in_RDI[4],(float)*(int *)((long)in_RDI + 0x24),
             CONCAT44(uVar14,(float)(int)in_RDI[5]),
             CONCAT44(uVar16,(float)*(int *)((long)in_RDI + 0x2c)),local_30,uStack_28);
  dVar13 = (double)(int)in_RDI[5] - 0.5;
  dVar15 = (double)*(int *)((long)in_RDI + 0x2c) - 0.5;
  al_draw_rectangle((float)(int)in_RDI[4] + 0.5,(float)*(int *)((long)in_RDI + 0x24) + 0.5,
                    CONCAT44((int)((ulong)dVar13 >> 0x20),(float)dVar13),
                    CONCAT44((int)((ulong)dVar15 >> 0x20),(float)dVar15),local_20,uStack_18,0);
  al_set_blender(0,1,3);
  iVar1 = *(int *)((long)in_RDI + 0x24);
  iVar2 = *(int *)((long)in_RDI + 0x2c);
  uVar10 = al_get_font_line_height(pTVar11->font);
  pAVar17 = pTVar11->font;
  lVar7 = in_RDI[4];
  lVar8 = in_RDI[5];
  uVar12 = std::__cxx11::string::c_str();
  al_draw_text(local_20,(int)uStack_18,
               (float)((1 - ((int)lVar7 + 1 + (int)lVar8 >> 0x1f)) + (int)lVar7 + (int)lVar8 >> 1),
               (float)((int)(~uVar10 + iVar1 + iVar2) / 2),pAVar17,1,uVar12);
  anon_unknown.dwarf_9285::SaveState::~SaveState((SaveState *)0x113164);
  return;
}

Assistant:

void Button::draw()
{
   const Theme & theme = this->dialog->get_theme();
   ALLEGRO_COLOR fg;
   ALLEGRO_COLOR bg;
   SaveState state;
   double y;

   if (this->pushed) {
      fg = theme.bg;
      bg = theme.fg;
   }
   else {
      fg = theme.fg;
      bg = theme.bg;
   }

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(this->x1, this->y1,
      this->x2, this->y2, bg);
   al_draw_rectangle(this->x1 + 0.5, this->y1 + 0.5,
      this->x2 - 0.5, this->y2 - 0.5, fg, 0);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   /* Center the text vertically in the button, taking the font size
    * into consideration.
    */
   y = (this->y1 + this->y2 - al_get_font_line_height(theme.font) - 1) / 2;

   al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
      y, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
}